

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall
llvm::yaml::Scanner::Scanner
          (Scanner *this,MemoryBufferRef Buffer,SourceMgr *SM_,bool ShowColors,error_code *EC)

{
  SmallVectorImpl<int> *pSVar1;
  SmallVectorImpl<(anonymous_namespace)::SimpleKey> *pSVar2;
  
  this->SM = SM_;
  (this->InputBuffer).Buffer.Data = (char *)0x0;
  (this->InputBuffer).Buffer.Length = 0;
  (this->InputBuffer).Identifier.Data = (char *)0x0;
  (this->InputBuffer).Identifier.Length = 0;
  this->ShowColors = ShowColors;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::AllocatorList(&this->TokenQueue);
  (this->Indents).super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
  super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX =
       &(this->Indents).super_SmallVectorStorage<int,_4U>;
  pSVar1 = &(this->Indents).super_SmallVectorImpl<int>;
  (pSVar1->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.Capacity = 4;
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
  BeginX = &(this->SimpleKeys).super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>;
  pSVar2 = &(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>;
  (pSVar2->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  (pSVar2->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
  Capacity = 4;
  this->EC = EC;
  init(this,(EVP_PKEY_CTX *)SM_);
  return;
}

Assistant:

Scanner::Scanner(MemoryBufferRef Buffer, SourceMgr &SM_, bool ShowColors,
                 std::error_code *EC)
    : SM(SM_), ShowColors(ShowColors), EC(EC) {
  init(Buffer);
}